

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::AsyncStreamFd::~AsyncStreamFd(AsyncStreamFd *this)

{
  Iface *pIVar1;
  Disposer *pDVar2;
  ForkHub<kj::_::Void> *pFVar3;
  
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)&PTR_read_006e1e48;
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
  _vptr_AsyncOutputStream = (_func_int **)&PTR_write_006e1f18;
  if (((this->ancillaryMsgCallback).ptr.isSet == true) &&
     (pIVar1 = (this->ancillaryMsgCallback).ptr.field_1.value.impl.ptr, pIVar1 != (Iface *)0x0)) {
    (this->ancillaryMsgCallback).ptr.field_1.value.impl.ptr = (Iface *)0x0;
    pDVar2 = (this->ancillaryMsgCallback).ptr.field_1.value.impl.disposer;
    (**pDVar2->_vptr_Disposer)(pDVar2,pIVar1 + *(long *)(*(long *)pIVar1 + -0x10));
  }
  if (((this->writeDisconnectedPromise).ptr.isSet == true) &&
     (pFVar3 = (this->writeDisconnectedPromise).ptr.field_1.value.hub.ptr,
     pFVar3 != (ForkHub<kj::_::Void> *)0x0)) {
    (this->writeDisconnectedPromise).ptr.field_1.value.hub.ptr = (ForkHub<kj::_::Void> *)0x0;
    pDVar2 = (this->writeDisconnectedPromise).ptr.field_1.value.hub.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pFVar3->super_ForkHubBase).super_PromiseArenaMember.
                              _vptr_PromiseArenaMember +
                      (long)(pFVar3->super_ForkHubBase).super_PromiseArenaMember.
                            _vptr_PromiseArenaMember[-2]));
  }
  UnixEventPort::FdObserver::~FdObserver(&this->observer);
  AsyncObject::~AsyncObject
            ((AsyncObject *)
             &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  OwnedFileDescriptor::~OwnedFileDescriptor(&this->super_OwnedFileDescriptor);
  return;
}

Assistant:

virtual ~AsyncStreamFd() noexcept(false) {}